

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
::try_emplace_impl<Key<4ul>const&>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
          *this,Key<4UL> *k)

{
  ctrl_t h;
  size_t sVar1;
  bool local_61;
  iterator local_60;
  bool local_49;
  iterator local_48;
  tuple<> local_31;
  tuple<const_Key<4UL>_&> local_30;
  size_t local_28;
  size_t offset;
  size_t hashval;
  Key<4UL> *k_local;
  raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
  *this_local;
  
  hashval = (size_t)k;
  k_local = (Key<4UL> *)this;
  offset = raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
           ::hash<Key<4ul>>((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
                             *)this,k);
  local_28 = raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
             ::_find_key<Key<4ul>>
                       ((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
                         *)this,(Key<4UL> *)hashval,offset);
  if (local_28 == 0xffffffffffffffff) {
    sVar1 = raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
            ::prepare_insert((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
                              *)this,offset);
    local_28 = sVar1;
    std::forward_as_tuple<Key<4ul>const&>((Key<4UL> *)&local_30);
    std::forward_as_tuple<>();
    raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<Key<4ul>const&>,std::tuple<>>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4ul>,unsigned_int>,Key<4ul>::Hash,phmap::EqualTo<Key<4ul>>,std::allocator<std::pair<Key<4ul>const,unsigned_int>>>
                *)this,sVar1,(piecewise_construct_t *)&std::piecewise_construct,&local_30,&local_31)
    ;
    sVar1 = local_28;
    h = H2(offset);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
                *)this,sVar1,h);
    local_48 = raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
               ::iterator_at((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
                              *)this,local_28);
    local_49 = true;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>::iterator,_bool,_true>
              (__return_storage_ptr__,&local_48,&local_49);
  }
  else {
    local_60 = raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
               ::iterator_at((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>
                              *)this,local_28);
    local_61 = false;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<4UL>,_unsigned_int>,_Key<4UL>::Hash,_phmap::EqualTo<Key<4UL>_>,_std::allocator<std::pair<const_Key<4UL>,_unsigned_int>_>_>::iterator,_bool,_true>
              (__return_storage_ptr__,&local_60,&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args) {
        size_t hashval = this->hash(k);
        size_t offset = this->_find_key(k, hashval);
        if (offset == (size_t)-1) {
            offset = this->prepare_insert(hashval);
            this->emplace_at(offset, std::piecewise_construct,
                             std::forward_as_tuple(std::forward<K>(k)),
                             std::forward_as_tuple(std::forward<Args>(args)...));
            this->set_ctrl(offset, H2(hashval));
            return {this->iterator_at(offset), true};
        }
        return {this->iterator_at(offset), false};
    }